

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_wString __thiscall
ON_Font::Description
          (ON_Font *this,NameLocale name_local,wchar_t family_separator,
          wchar_t weight_width_slope_separator,bool bIncludeUndelinedAndStrikethrough,
          bool bIncludeNotOnDevice)

{
  bool bVar1;
  undefined7 in_register_00000031;
  int *piVar2;
  ON_wString wws;
  char in_stack_00000008;
  ON_wString family_name;
  ON_wString logfont_name;
  undefined1 auStack_38 [24];
  
  piVar2 = (int *)CONCAT71(in_register_00000031,name_local);
  ON_wString::ON_wString((ON_wString *)this);
  if (((in_stack_00000008 != '\0') && (*piVar2 != 0)) &&
     (((uint)*(undefined8 *)(piVar2 + 0x2e) & 3) == 2)) {
    ON_wString::ON_wString((ON_wString *)(auStack_38 + 0x10),L"[Not on device] ");
    ON_wString::operator+=((ON_wString *)this,(ON_wString *)(auStack_38 + 0x10));
    ON_wString::~ON_wString((ON_wString *)(auStack_38 + 0x10));
  }
  FamilyName((ON_Font *)(auStack_38 + 0x10));
  ON_wString::TrimLeftAndRight((ON_wString *)(auStack_38 + 0x10),(wchar_t *)0x0);
  WindowsLogfontName((ON_Font *)&stack0xffffffffffffffe0);
  ON_wString::TrimLeftAndRight((ON_wString *)&stack0xffffffffffffffe0,(wchar_t *)0x0);
  bVar1 = ON_wString::IsEmpty((ON_wString *)(auStack_38 + 0x10));
  if (bVar1) {
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)&stack0xffffffffffffffe0);
    if (!bVar1) goto LAB_004a6f6e;
    ON_wString::operator+=((ON_wString *)this,(ON_wString *)&stack0xffffffffffffffe0);
    WidthWeightSlantDescription((ON_Font *)auStack_38);
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)auStack_38);
    if (bVar1) {
      ON_wString::ON_wString((ON_wString *)(auStack_38 + 8),L" (");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)(auStack_38 + 8));
      ON_wString::~ON_wString((ON_wString *)(auStack_38 + 8));
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)auStack_38);
      ON_wString::ON_wString((ON_wString *)(auStack_38 + 8),L")");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)(auStack_38 + 8));
      ON_wString::~ON_wString((ON_wString *)(auStack_38 + 8));
    }
  }
  else {
LAB_004a6f6e:
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)(auStack_38 + 0x10));
    if (bVar1) {
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)(auStack_38 + 0x10));
      FaceName((ON_Font *)auStack_38);
      ON_wString::TrimLeftAndRight((ON_wString *)auStack_38,(wchar_t *)0x0);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)auStack_38);
      if (bVar1) {
        ON_wString::ON_wString((ON_wString *)(auStack_38 + 8),L" ");
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)(auStack_38 + 8));
        ON_wString::~ON_wString((ON_wString *)(auStack_38 + 8));
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)auStack_38);
      }
    }
    else {
      PostScriptName((ON_Font *)auStack_38);
      ON_wString::TrimLeftAndRight((ON_wString *)auStack_38,(wchar_t *)0x0);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)auStack_38);
      if (bVar1) {
        ON_wString::operator+=((ON_wString *)this,(ON_wString *)auStack_38);
      }
    }
  }
  ON_wString::~ON_wString((ON_wString *)auStack_38);
  bVar1 = ON_wString::IsEmpty((ON_wString *)this);
  if (bVar1) {
    WidthWeightSlantDescription((ON_Font *)auStack_38);
    ON_wString::operator=((ON_wString *)this,(ON_wString *)auStack_38);
    ON_wString::~ON_wString((ON_wString *)auStack_38);
  }
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar1) {
    if ((*(byte *)((long)piVar2 + 0x1b) & *(byte *)(piVar2 + 7)) == 1) {
      ON_wString::ON_wString((ON_wString *)auStack_38,L" (underlined,strikethrough)");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)auStack_38);
    }
    else if (*(byte *)((long)piVar2 + 0x1b) == 0) {
      if (*(byte *)(piVar2 + 7) == 0) goto LAB_004a70bc;
      ON_wString::ON_wString((ON_wString *)auStack_38,L" (strikethrough)");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)auStack_38);
    }
    else {
      ON_wString::ON_wString((ON_wString *)auStack_38,L" (underlined)");
      ON_wString::operator+=((ON_wString *)this,(ON_wString *)auStack_38);
    }
    ON_wString::~ON_wString((ON_wString *)auStack_38);
  }
LAB_004a70bc:
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffe0);
  ON_wString::~ON_wString((ON_wString *)(auStack_38 + 0x10));
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_Font::Description(
  ON_Font::NameLocale name_local,
  wchar_t family_separator,
  wchar_t weight_width_slope_separator,
  bool bIncludeUndelinedAndStrikethrough,
  bool bIncludeNotOnDevice
) const
{
  ON_wString description;

  if (bIncludeNotOnDevice && this->IsManagedSubstitutedFont())
  {
    description += ON_wString(L"[Not on device] ");
  }

  ON_wString family_name = FamilyName();
  family_name.TrimLeftAndRight();
  ON_wString logfont_name = WindowsLogfontName();
  logfont_name.TrimLeftAndRight();
  if (family_name.IsEmpty() && logfont_name.IsNotEmpty())
  {
    // LOGFONT (width-weight-slant)
    description += logfont_name;

    const ON_wString wws = this->WidthWeightSlantDescription();
    if (wws.IsNotEmpty())
    {
      description += ON_wString(L" (");
      description += wws;
      description += ON_wString(L")");
    }
  }
  else if (family_name.IsNotEmpty() )
  {
    // family face
    description += family_name;
    ON_wString face_name = FaceName();
    face_name.TrimLeftAndRight();
    if ( face_name.IsNotEmpty() )
    {
      description += ON_wString(L" ");
      description += face_name;
    }
  }
  else
  {
    ON_wString postscript_name = PostScriptName();
    postscript_name.TrimLeftAndRight();
    if (postscript_name.IsNotEmpty())
      description += postscript_name;
  }

  if (description.IsEmpty())
    description = this->WidthWeightSlantDescription();

  if (description.IsNotEmpty())
  {
    const bool bUnderlined = IsUnderlined();
    const bool bStrikethrough = IsStrikethrough();
    if (bUnderlined && bStrikethrough)
      description += ON_wString(L" (underlined,strikethrough)");
    else if (bUnderlined)
      description += ON_wString(L" (underlined)");
    else if (bStrikethrough)
      description += ON_wString(L" (strikethrough)");
  }

  return description;
}